

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_hash_table_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::hash_table_subscr_storage::storage_t::destroy_all_subscriptions(storage_t *this)

{
  _Rb_tree_node_base *o;
  _Base_ptr p_Var1;
  bool bVar2;
  agent_t *paVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *this_00;
  
  p_Var4 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = (_Rb_tree_node_base *)0x0;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
      (*(this->super_subscription_storage_t)._vptr_subscription_storage_t[7])(this);
      return;
    }
    o = p_Var4 + 1;
    if (this_00 == (_Rb_tree_node_base *)0x0) {
LAB_002481e0:
      p_Var1 = p_Var4[1]._M_right;
      paVar3 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (**(code **)(*(long *)p_Var1 + 0x20))(p_Var1,&p_Var4[1]._M_parent,paVar3);
    }
    else {
      bVar2 = key_t::is_same_mbox_msg_pair((key_t *)this_00,(key_t *)o);
      if (!bVar2) goto LAB_002481e0;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    this_00 = o;
  } while( true );
}

Assistant:

void
storage_t::destroy_all_subscriptions()
	{
		{
			const map_t::value_type * previous = nullptr;
			for( auto & i : m_map )
			{
				// Optimisation: for several consequtive keys with
				// the same (mbox, msg_type) pair it is necessary to
				// call unsubscribe_event_handlers only once.
				if( !previous ||
						!previous->first.is_same_mbox_msg_pair( i.first ) )
					i.second->unsubscribe_event_handlers(
						i.first.m_msg_type,
						owner() );

				previous = &i;
			}
		}

		drop_content();
	}